

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O1

int Fra_SmlCheckNonConstOutputs(Fra_Sml_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *pAVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  pAVar4 = p->pAig;
  uVar7 = pAVar4->nObjs[3] - pAVar4->nRegs;
  if (uVar7 != 0 && pAVar4->nRegs <= pAVar4->nObjs[3]) {
    uVar1 = pAVar4->vCos->nSize;
    uVar6 = 0;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar6;
    }
    do {
      if (uVar6 == uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = p->nWordsTotal;
      iVar3 = p->nWordsPref;
      if (iVar3 < iVar2) {
        lVar8 = 0;
        do {
          if (*(int *)((long)&p[1].pAig +
                      lVar8 * 4 +
                      (long)(*(int *)((long)pAVar4->vCos->pArray[uVar6] + 0x24) * iVar2) * 4 +
                      (long)iVar3 * 4) != 0) {
            return 1;
          }
          lVar8 = lVar8 + 1;
        } while (iVar2 - iVar3 != (int)lVar8);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar7);
  }
  return 0;
}

Assistant:

int Fra_SmlCheckNonConstOutputs( Fra_Sml_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachPoSeq( p->pAig, pObj, i )
        if ( !Fra_SmlNodeIsZero(p, pObj) )
            return 1;
    return 0;
}